

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_UShort FT_Stream_ReadUShortLE(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  FT_UShort local_32;
  FT_UShort *pFStack_30;
  FT_UShort result;
  FT_Byte *p;
  FT_Error *pFStack_20;
  FT_Byte reads [2];
  FT_Error *error_local;
  FT_Stream stream_local;
  
  local_32 = 0;
  *error = 0;
  pFStack_20 = error;
  if (stream->pos + 1 < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      pFStack_30 = (FT_UShort *)(stream->base + stream->pos);
    }
    else {
      uVar1 = (*stream->read)(stream,stream->pos,(uchar *)((long)&p + 6),2);
      if (uVar1 != 2) goto LAB_0014b1c6;
      pFStack_30 = (FT_UShort *)((long)&p + 6);
    }
    if (pFStack_30 != (FT_UShort *)0x0) {
      local_32 = *pFStack_30;
    }
    stream->pos = stream->pos + 2;
    stream_local._6_2_ = local_32;
  }
  else {
LAB_0014b1c6:
    *pFStack_20 = 0x55;
    stream_local._6_2_ = 0;
  }
  return stream_local._6_2_;
}

Assistant:

FT_BASE_DEF( FT_UShort )
  FT_Stream_ReadUShortLE( FT_Stream  stream,
                          FT_Error*  error )
  {
    FT_Byte    reads[2];
    FT_Byte*   p      = 0;
    FT_UShort  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->pos + 1 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 2L ) != 2L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_USHORT_LE( p );
    }
    else
      goto Fail;

    stream->pos += 2;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadUShortLE:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }